

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int validate_stream_params
              (cubeb_stream_params *input_stream_params,cubeb_stream_params *output_stream_params)

{
  uint *in_RSI;
  uint *in_RDI;
  cubeb_stream_params *params;
  uint *local_28;
  int local_4;
  
  if ((in_RDI == (uint *)0x0) && (in_RSI == (uint *)0x0)) {
    fprintf(_stderr,"%s:%d - fatal error: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb.c",
            0x5f,"input_stream_params || output_stream_params");
    abort();
  }
  if ((in_RSI == (uint *)0x0) ||
     ((((999 < in_RSI[1] && (in_RSI[1] < 0x2ee01)) && (in_RSI[2] != 0)) && (in_RSI[2] < 0x100)))) {
    if ((in_RDI == (uint *)0x0) ||
       (((999 < in_RDI[1] && (in_RDI[1] < 0x2ee01)) && ((in_RDI[2] != 0 && (in_RDI[2] < 0x100))))))
    {
      if (((in_RDI == (uint *)0x0) || (in_RSI == (uint *)0x0)) ||
         ((in_RDI[1] == in_RSI[1] && (*in_RDI == *in_RSI)))) {
        local_28 = in_RSI;
        if (in_RDI != (uint *)0x0) {
          local_28 = in_RDI;
        }
        if (*local_28 < 4) {
          local_4 = 0;
        }
        else {
          local_4 = -2;
        }
      }
      else {
        local_4 = -2;
      }
    }
    else {
      local_4 = -2;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

static int
validate_stream_params(cubeb_stream_params * input_stream_params,
                       cubeb_stream_params * output_stream_params)
{
  XASSERT(input_stream_params || output_stream_params);
  if (output_stream_params) {
    if (output_stream_params->rate < 1000 ||
        output_stream_params->rate > 192000 ||
        output_stream_params->channels < 1 ||
        output_stream_params->channels > UINT8_MAX) {
      return CUBEB_ERROR_INVALID_FORMAT;
    }
  }
  if (input_stream_params) {
    if (input_stream_params->rate < 1000 ||
        input_stream_params->rate > 192000 ||
        input_stream_params->channels < 1 ||
        input_stream_params->channels > UINT8_MAX) {
      return CUBEB_ERROR_INVALID_FORMAT;
    }
  }
  // Rate and sample format must be the same for input and output, if using a
  // duplex stream
  if (input_stream_params && output_stream_params) {
    if (input_stream_params->rate != output_stream_params->rate ||
        input_stream_params->format != output_stream_params->format) {
      return CUBEB_ERROR_INVALID_FORMAT;
    }
  }

  cubeb_stream_params * params =
      input_stream_params ? input_stream_params : output_stream_params;

  switch (params->format) {
  case CUBEB_SAMPLE_S16LE:
  case CUBEB_SAMPLE_S16BE:
  case CUBEB_SAMPLE_FLOAT32LE:
  case CUBEB_SAMPLE_FLOAT32BE:
    return CUBEB_OK;
  }

  return CUBEB_ERROR_INVALID_FORMAT;
}